

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall Client::Client(Client *this)

{
  int iVar1;
  impl_ *piVar2;
  
  this->_vptr_Client = (_func_int **)&PTR_NeedTick_00201220;
  piVar2 = (impl_ *)operator_new(0x14);
  iVar1 = socket(2,1,6);
  (piVar2->sin).sin_family = 0;
  (piVar2->sin).sin_port = 0;
  (piVar2->sin).sin_addr = 0;
  (piVar2->sin).sin_zero[0] = '\0';
  (piVar2->sin).sin_zero[1] = '\0';
  (piVar2->sin).sin_zero[2] = '\0';
  (piVar2->sin).sin_zero[3] = '\0';
  (piVar2->sin).sin_zero[4] = '\0';
  (piVar2->sin).sin_zero[5] = '\0';
  (piVar2->sin).sin_zero[6] = '\0';
  (piVar2->sin).sin_zero[7] = '\0';
  piVar2->sock = iVar1;
  (this->impl)._M_t.super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
  super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
  super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl = piVar2;
  this->server = (Server *)0x0;
  this->connected = false;
  this->connect_time = 0;
  (this->recv_buffer)._M_dataplus._M_p = (pointer)&(this->recv_buffer).field_2;
  (this->recv_buffer)._M_string_length = 0;
  (this->recv_buffer).field_2._M_local_buf[0] = '\0';
  this->recv_buffer_gpos = 0;
  this->recv_buffer_ppos = 0;
  this->recv_buffer_used = 0;
  (this->send_buffer)._M_dataplus._M_p = (pointer)&(this->send_buffer).field_2;
  (this->send_buffer)._M_string_length = 0;
  (this->send_buffer).field_2._M_local_buf[0] = '\0';
  this->send_buffer_gpos = 0;
  this->send_buffer_ppos = 0;
  this->send_buffer_used = 0;
  return;
}

Assistant:

Client::Client()
	: impl(new impl_(socket(AF_INET, SOCK_STREAM, IPPROTO_TCP)))
	, server(0)
	, connected(false)
	, connect_time(0)
	, recv_buffer_gpos(0)
	, recv_buffer_ppos(0)
	, recv_buffer_used(0)
	, send_buffer_gpos(0)
	, send_buffer_ppos(0)
	, send_buffer_used(0)
{ }